

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O2

string * __thiscall lest::transformed_abi_cxx11_(string *__return_storage_ptr__,lest *this,char chr)

{
  size_type sVar1;
  byte bVar2;
  ulong uVar3;
  _Alloc_hider _Var4;
  ulong uVar5;
  ulong uVar6;
  size_type *psVar7;
  string *psVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  string local_80;
  string local_60;
  string local_40;
  
  uVar6 = (ulong)(byte)chr;
  bVar2 = (byte)this;
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar5 == 0x50) {
      if (bVar2 < 0x20) {
        to_hex_string_abi_cxx11_(&local_60,(lest *)(ulong)(uint)(int)(char)bVar2,(char)uVar6);
        paVar9 = &local_60.field_2;
        _Var4._M_p = local_60._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_60._M_dataplus._M_p == paVar9) {
          local_80.field_2._8_8_ = local_60.field_2._8_8_;
          _Var4._M_p = (pointer)&local_80.field_2;
        }
        local_80.field_2._M_allocated_capacity = local_60.field_2._M_allocated_capacity;
        psVar8 = &local_60;
      }
      else {
        paVar9 = &local_40.field_2;
        local_40._M_dataplus._M_p = (pointer)paVar9;
        std::__cxx11::string::_M_construct((ulong)&local_40,'\x01');
        _Var4._M_p = local_40._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p == paVar9) {
          local_80.field_2._8_8_ = local_40.field_2._8_8_;
          _Var4._M_p = (pointer)&local_80.field_2;
        }
        local_80.field_2._M_allocated_capacity = local_40.field_2._M_allocated_capacity;
        psVar8 = &local_40;
      }
      psVar7 = &psVar8->_M_string_length;
      sVar1 = *psVar7;
      (((string *)(psVar7 + -1))->_M_dataplus)._M_p = (pointer)paVar9;
      *psVar7 = 0;
      paVar9->_M_local_buf[0] = '\0';
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
      if (_Var4._M_p == local_80._M_dataplus._M_p) {
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_80.field_2._M_allocated_capacity;
        *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_80.field_2._8_8_;
      }
      else {
        (__return_storage_ptr__->_M_dataplus)._M_p = _Var4._M_p;
        (__return_storage_ptr__->field_2)._M_allocated_capacity =
             local_80.field_2._M_allocated_capacity;
      }
      __return_storage_ptr__->_M_string_length = sVar1;
      local_80._M_string_length = 0;
      local_80.field_2._M_allocated_capacity =
           local_80.field_2._M_allocated_capacity & 0xffffffffffffff00;
      std::__cxx11::string::~string((string *)&local_80);
      if (bVar2 < 0x20) {
        psVar8 = &local_60;
      }
      else {
        psVar8 = &local_40;
      }
      goto LAB_00193fac;
    }
    uVar6 = uVar5 + 0x10;
    uVar3 = uVar6;
  } while ((&DAT_001b1d30)[uVar5] != bVar2);
  std::__cxx11::string::string
            ((string *)&local_80,*(char **)((long)&PTR_anon_var_dwarf_3d6e7_001b1d38 + uVar5),
             (allocator *)&local_60);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p == &local_80.field_2) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_80.field_2._M_allocated_capacity
    ;
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_80.field_2._8_8_;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_80._M_dataplus._M_p;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = local_80.field_2._M_allocated_capacity
    ;
  }
  psVar8 = &local_80;
  __return_storage_ptr__->_M_string_length = local_80._M_string_length;
  local_80._M_string_length = 0;
  local_80.field_2._M_allocated_capacity =
       local_80.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
LAB_00193fac:
  std::__cxx11::string::~string((string *)psVar8);
  return __return_storage_ptr__;
}

Assistant:

inline std::string transformed( char chr )
{
    struct Tr { char chr; char const * str; } table[] =
    {
        {'\\', "\\\\" },
        {'\r', "\\r"  }, {'\f', "\\f" },
        {'\n', "\\n"  }, {'\t', "\\t" },
    };

    for ( Tr * pos = table; pos != table + lest_DIMENSION_OF( table ); ++pos )
    {
        if ( chr == pos->chr )
            return pos->str;
    }

    return unprintable( chr  ) ? to_hex_string( chr ) : std::string( 1, chr );
}